

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O3

config_value * config_value_duplicate(config_value *value)

{
  config_array *pcVar1;
  ulong uVar2;
  anon_union_8_4_a3489a58_for_data aVar3;
  undefined4 uVar4;
  config_value *__ptr;
  config_array *array;
  config_value *pcVar5;
  char *pcVar6;
  ulong uVar7;
  
  __ptr = (config_value *)malloc(0x10);
  if (__ptr != (config_value *)0x0) {
    uVar4 = *(undefined4 *)&value->field_0x4;
    aVar3 = value->data;
    __ptr->type = value->type;
    *(undefined4 *)&__ptr->field_0x4 = uVar4;
    __ptr->data = aVar3;
    switch(value->type) {
    case ARRAY:
      pcVar1 = (value->data).array;
      array = config_array_create(pcVar1->length);
      if (array != (config_array *)0x0) {
        uVar2 = array->length;
        if (uVar2 != 0) {
          uVar7 = 0;
          do {
            pcVar5 = config_value_duplicate(pcVar1->values[uVar7]);
            if (pcVar5 == (config_value *)0x0) {
              config_array_destroy(array);
              goto switchD_001078ea_default;
            }
            array->values[uVar7] = pcVar5;
            uVar7 = uVar7 + 1;
          } while (uVar7 < uVar2);
        }
        (__ptr->data).array = array;
        return __ptr;
      }
      break;
    case BOOLEAN:
      (__ptr->data).boolean = (value->data).boolean;
      return __ptr;
    case NUMBER:
      __ptr->data = value->data;
      return __ptr;
    case STRING:
      pcVar6 = string_init((value->data).string);
      (__ptr->data).string = pcVar6;
      if (pcVar6 != (char *)0x0) {
        return __ptr;
      }
    }
switchD_001078ea_default:
    free(__ptr);
  }
  return (config_value *)0x0;
}

Assistant:

struct config_value *config_value_duplicate(const struct config_value *value)
{
        struct config_value *new_value = malloc(sizeof(struct config_value));

        if (new_value == NULL) {
                return NULL;
        }

        memcpy(new_value, value, sizeof(struct config_value));

        switch (value->type) {
        case ARRAY:
                new_value->data.array = config_array_duplicate(value->data.array);

                if (new_value->data.array == NULL) {
                        goto free_and_error;
                }

                break;
        case BOOLEAN:
                new_value->data.boolean = value->data.boolean;

                break;
        case STRING:
                new_value->data.string = string_init(value->data.string);

                if (new_value->data.string == NULL) {
                        goto free_and_error;
                }

                break;
        case NUMBER:
                new_value->data.number = value->data.number;

                break;
        default:
                goto free_and_error;
        }

        return new_value;

free_and_error:
        free(new_value);

        return NULL;
}